

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::flux_divergenceRD
          (PeleLM *this,MultiFab *a_state,int stateComp,MultiFab *a_divergence,int divComp,
          MultiFab **a_fluxes,int fluxComp,int nComp,BCRec *d_bc,Real scale,Real a_dt,
          int areSpeciesFluxes)

{
  bool bVar1;
  FabType FVar2;
  MFIter *mfi_00;
  FabFactory<amrex::FArrayBox> *pFVar3;
  FabArrayBase *in_RSI;
  long in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  anon_class_128_2_4d1f6035 *in_stack_00000018;
  int in_stack_00000020;
  Array4<double> scratch;
  Elixir eli;
  FArrayBox tmpfab;
  Box gbx;
  Array4<const_double> *vfrac_arr;
  Array4<const_double> *ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Box result;
  Array4<double> *divT_arr;
  Array4<const_amrex::EBCellFlag> *in_stack_00000810;
  Array4<const_double> *in_stack_00000818;
  Array4<const_double> *in_stack_00000820;
  Array4<const_double> *in_stack_00000828;
  Array4<double> *div_arr;
  Array4<const_double> *in_stack_00000838;
  Array4<const_double> *in_stack_00000840;
  Array4<const_double> *in_stack_00000848;
  Array4<const_double> *in_stack_00000850;
  BCRec *in_stack_00000858;
  Geometry *in_stack_00000860;
  string *in_stack_00000868;
  int in_stack_00000870;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  Box *bx;
  MFIter mfi;
  EBFArrayBoxFactory *ebfact;
  MultiFab divTemp;
  AmrLevel *in_stack_fffffffffffff280;
  int start_comp;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff288;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff290;
  Periodicity *in_stack_fffffffffffff298;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff2a0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff2a8;
  Geometry *in_stack_fffffffffffff2b0;
  BoxArray *in_stack_fffffffffffff2b8;
  anon_class_128_2_4d1f6035 *in_stack_fffffffffffff2c0;
  anon_class_64_1_f62ae5da *in_stack_fffffffffffff2c8;
  Box *in_stack_fffffffffffff2d0;
  MFIter *in_stack_fffffffffffff2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff3a0;
  EBCellFlagFab *in_stack_fffffffffffff3a8;
  undefined1 local_b88 [64];
  undefined1 auStack_b48 [64];
  undefined1 local_b08 [64];
  Box local_ac8 [3];
  undefined1 local_a68 [64];
  Box local_a28 [3];
  undefined1 local_9c8 [96];
  Array4<double> local_968;
  undefined1 local_910 [72];
  _Rb_tree_impl<std::less<amrex::Box>,_true> local_8c8 [2];
  size_t *local_860;
  undefined1 local_858 [64];
  undefined1 *local_818;
  undefined8 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  element_type *in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8bc;
  element_type *in_stack_fffffffffffff8c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff8c8;
  undefined1 local_6f0 [176];
  undefined1 local_640 [76];
  Real local_5f4;
  Real local_5ec;
  int local_5e4;
  Arena local_5e0 [2];
  Arena *local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [2];
  undefined8 local_558;
  MFIter local_550;
  int *local_4e0;
  MFIter local_4d8;
  undefined8 local_478;
  IntVect local_470;
  element_type *local_460;
  int local_458;
  undefined8 local_448;
  int aiStack_440 [6];
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 uVar4;
  int *dt;
  EBCellFlagFab *scratch_00;
  Array4<const_double> *in_stack_fffffffffffffdc0;
  Array4<double> *in_stack_fffffffffffffdc8;
  Array4<double> *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffddc;
  Box *in_stack_fffffffffffffde0;
  Dim3 local_1dc;
  Dim3 local_1d0;
  Dim3 local_1c0;
  int local_1b4;
  Box *local_1b0;
  EBCellFlag *local_1a8;
  Dim3 local_1a0;
  Box *local_190;
  int local_188;
  int iStack_184;
  int local_180;
  undefined4 local_17c;
  Box *local_178;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  Dim3 local_150;
  Box *local_140;
  int local_138;
  int iStack_134;
  int local_130;
  undefined4 local_12c;
  IntVect *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  Dim3 local_100;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  int local_c4;
  Box *local_c0;
  EBCellFlag *local_b8;
  Dim3 local_b0;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  Box *local_88;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  Dim3 local_60;
  Box *local_50;
  int local_48;
  int iStack_44;
  int local_40;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  
  local_298._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  amrex::FabArrayBase::nGrow(in_RSI,0);
  aiStack_440[2] = 0;
  aiStack_440[3] = 0;
  aiStack_440._16_8_ = 0;
  local_448._0_4_ = 0;
  local_448._4_4_ = 0;
  aiStack_440[0] = 0;
  aiStack_440[1] = 0;
  local_428._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )0x0;
  amrex::MFInfo::MFInfo((MFInfo *)0x50b730);
  mfi_00 = (MFIter *)amrex::AmrLevel::Factory(in_stack_fffffffffffff280);
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
             (DistributionMapping *)in_stack_fffffffffffff2b0,
             (int)((ulong)in_stack_fffffffffffff2a8 >> 0x20),(int)in_stack_fffffffffffff2a8,
             (MFInfo *)in_stack_fffffffffffff2a0,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff2d0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x50b789);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff280,(value_type)mfi_00);
  flux_divergence((PeleLM *)in_stack_fffffffffffff8c8._M_pi,(MultiFab *)in_stack_fffffffffffff8c0,
                  in_stack_fffffffffffff8bc,(MultiFab **)in_stack_fffffffffffff8b0,
                  in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8,
                  (Real)in_stack_fffffffffffff8a0);
  local_470.vect = (int  [3])amrex::Geometry::periodicity(in_stack_fffffffffffff2b0);
  local_458 = local_470.vect[2];
  local_460 = (element_type *)local_470.vect._0_8_;
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
             SUB81((ulong)in_stack_fffffffffffff290 >> 0x38,0));
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff2a0 >> 0x38);
  pFVar3 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x50b839);
  local_478 = __dynamic_cast(pFVar3,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_478 != 0) {
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,(bool)do_tiling_);
    while (bVar1 = amrex::MFIter::isValid(&local_4d8), bVar1) {
      amrex::MFIter::tilebox(in_stack_fffffffffffff2e0);
      local_4e0 = (int *)((long)&local_550.local_tile_index_map + 4);
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
      local_550.tile_array =
           (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
           amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                     ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff280,mfi_00);
      local_1a8 = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_1b0 = &(((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain;
      local_1b4 = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_15c = 0;
      local_188 = (local_1b0->smallend).vect[0];
      local_16c = 1;
      iStack_184 = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain.smallend.vect[1];
      local_1d0.x = (local_1b0->smallend).vect[0];
      local_1d0.y = (local_1b0->smallend).vect[1];
      local_17c = 2;
      local_1d0.z = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                    domain.smallend.vect[2];
      local_108 = &(((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain.bigend;
      local_10c = 0;
      local_138 = local_108->vect[0] + 1;
      local_118 = &(((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain.bigend;
      local_11c = 1;
      iStack_134 = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain.bigend.vect[1] + 1;
      local_128 = &(((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                   domain.bigend;
      local_12c = 2;
      local_1dc.z = (((EBCellFlagFab *)local_550.tile_array)->super_BaseFab<amrex::EBCellFlag>).
                    domain.bigend.vect[2] + 1;
      local_1dc.y = iStack_134;
      local_1dc.x = local_138;
      scratch_00 = (EBCellFlagFab *)local_550.tile_array;
      local_1c0._0_8_ = local_1d0._0_8_;
      local_1c0.z = local_1d0.z;
      local_1a0._0_8_ = local_1d0._0_8_;
      local_1a0.z = local_1d0.z;
      local_190 = local_1b0;
      local_180 = local_1d0.z;
      local_178 = local_1b0;
      local_168 = local_1b0;
      local_158 = local_1b0;
      local_150._0_8_ = local_1dc._0_8_;
      local_150.z = local_1dc.z;
      local_140 = local_1b0;
      local_130 = local_1dc.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                ((Array4<const_amrex::EBCellFlag> *)&local_550,local_1a8,&local_1c0,&local_1dc,
                 local_1b4);
      local_550.local_index_map = (Vector<int,_std::allocator<int>_> *)&local_550;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff290,(MFIter *)in_stack_fffffffffffff288,
                 (int)((ulong)in_stack_fffffffffffff280 >> 0x20));
      local_558 = local_598;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff288,(MFIter *)in_stack_fffffffffffff280);
      local_5a0 = local_5e0;
      FVar2 = amrex::EBCellFlagFab::getType
                        (in_stack_fffffffffffff3a8,(Box *)in_stack_fffffffffffff3a0._M_pi);
      if (FVar2 != covered) {
        uVar4 = 4;
        local_640._68_8_ = *(undefined8 *)local_4e0;
        local_5f4 = *(Real *)(local_4e0 + 2);
        local_5ec = *(Real *)(local_4e0 + 4);
        local_5e4 = local_4e0[6];
        dt = local_4e0;
        amrex::Box::grow((Box *)(local_640 + 0x44),4);
        FVar2 = amrex::EBCellFlagFab::getType
                          (in_stack_fffffffffffff3a8,(Box *)in_stack_fffffffffffff3a0._M_pi);
        if (FVar2 == regular) {
          memcpy(local_b88,(void *)local_558,0x3c);
          memcpy(auStack_b48,local_5a0,0x3c);
          amrex::
          ParallelFor<int,PeleLM::flux_divergenceRD(amrex::MultiFab_const&,int,amrex::MultiFab&,int,amrex::MultiFab_const*const*,int,int,amrex::BCRec_const*,double,double,int)::__1,void>
                    (in_stack_fffffffffffff2d0,(int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
                     in_stack_fffffffffffff2c0);
        }
        else {
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff280,
                     (size_type)mfi_00);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff280,mfi_00);
          local_818 = local_858;
          amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff280);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff288,(MFIter *)in_stack_fffffffffffff280);
          local_8c8[0]._0_4_ = local_4e0[0];
          local_8c8[0]._4_4_ = local_4e0[1];
          local_8c8[0].super__Rb_tree_header._M_header._12_8_ = *(undefined8 *)(local_4e0 + 5);
          local_8c8[0].super__Rb_tree_header._M_header._M_parent._0_4_ =
               (int)((ulong)*(undefined8 *)(local_4e0 + 3) >> 0x20);
          local_8c8[0].super__Rb_tree_header._M_header._M_color =
               (_Rb_tree_color)*(undefined8 *)(local_4e0 + 2);
          local_8c8[0].super__Rb_tree_header._M_header._4_4_ =
               (undefined4)((ulong)*(undefined8 *)(local_4e0 + 2) >> 0x20);
          local_860 = &local_8c8[0].super__Rb_tree_header._M_node_count;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff280,(char *)mfi_00);
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff280,(char *)mfi_00), bVar1)) {
            amrex::Box::grow((Box *)local_8c8,3);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff280,(char *)mfi_00);
            if (bVar1) {
              amrex::Box::grow((Box *)local_8c8,2);
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)in_stack_fffffffffffff290,(Box *)in_stack_fffffffffffff288,
                     (int)((ulong)in_stack_fffffffffffff280 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff280 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffff280 >> 0x10,0),(Arena *)mfi_00);
          in_stack_fffffffffffff3a8 = (EBCellFlagFab *)local_910;
          amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_fffffffffffff2a8);
          local_b8 = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).dptr;
          local_c0 = &(in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain;
          local_c4 = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).nvar;
          local_6c = 0;
          local_98 = (local_c0->smallend).vect[0];
          local_7c = 1;
          iStack_94 = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.
                      vect[1];
          local_e0.x = (local_c0->smallend).vect[0];
          local_e0.y = (local_c0->smallend).vect[1];
          local_8c = 2;
          local_e0.z = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.smallend
                       .vect[2];
          local_18 = &(in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
          local_1c = 0;
          local_48 = local_18->vect[0] + 1;
          local_28 = &(in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
          local_2c = 1;
          iStack_44 = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                      vect[1] + 1;
          local_38 = &(in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
          local_3c = 2;
          local_100.z = (in_stack_fffffffffffff3a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                        vect[2] + 1;
          local_100.y = iStack_44;
          local_100.x = local_48;
          local_f0._0_8_ = local_100._0_8_;
          local_f0.z = local_100.z;
          local_d0._0_8_ = local_e0._0_8_;
          local_d0.z = local_e0.z;
          local_b0._0_8_ = local_e0._0_8_;
          local_b0.z = local_e0.z;
          local_a0 = local_c0;
          local_90 = local_e0.z;
          local_88 = local_c0;
          local_78 = local_c0;
          local_68 = local_c0;
          local_60._0_8_ = local_100._0_8_;
          local_60.z = local_100.z;
          local_50 = local_c0;
          local_40 = local_100.z;
          amrex::Array4<double>::Array4
                    ((Array4<double> *)&stack0xfffffffffffffdc0,(double *)local_b8,&local_d0,
                     &local_f0,local_c4);
          amrex::Array4<double>::Array4<double,_0>
                    (&local_968,(Array4<double> *)&stack0xfffffffffffffdc0,0);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff280,(char *)mfi_00);
          if (bVar1) {
            amrex::Box::Box<double>((Box *)in_stack_fffffffffffff280,(Array4<double> *)mfi_00);
            memcpy(local_9c8,&local_968,0x3c);
            amrex::
            ParallelFor<PeleLM::flux_divergenceRD(amrex::MultiFab_const&,int,amrex::MultiFab&,int,amrex::MultiFab_const*const*,int,int,amrex::BCRec_const*,double,double,int)::__0>
                      (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
          }
          start_comp = (int)((ulong)in_stack_fffffffffffff280 >> 0x20);
          in_stack_fffffffffffff2c0 = in_stack_00000018;
          if (in_stack_00000020 == 0) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff290,(MFIter *)in_stack_fffffffffffff288,start_comp);
            mfi_00 = (MFIter *)local_550.local_index_map;
            in_stack_fffffffffffff2c8 = (anon_class_64_1_f62ae5da *)(in_RDI + 0x10);
            std::__cxx11::string::string
                      ((string *)(local_b08 + 0x40),
                       (string *)&diffusion_redistribution_type_abi_cxx11_);
            in_stack_fffffffffffff2e0 = (MFIter *)local_b08;
            amrex::Array4<const_double>::Array4((Array4<const_double> *)in_stack_fffffffffffff2e0);
            in_stack_fffffffffffff2d0 = (Box *)(local_b08 + 0x40);
            in_stack_fffffffffffff2a8 = (FabArrayBase *)&stack0xfffffffffffff860;
            in_stack_fffffffffffff290 = (FabArray<amrex::FArrayBox> *)local_6f0;
            in_stack_fffffffffffff288 = (FabArray<amrex::FArrayBox> *)(local_6f0 + 0x58);
            in_stack_fffffffffffff280 = (AmrLevel *)local_640;
            Redistribution::Apply
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0
                       ,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                       (Array4<double> *)scratch_00,in_stack_00000810,in_stack_00000818,
                       in_stack_00000820,in_stack_00000828,(Array4<const_double> *)div_arr,
                       in_stack_00000838,in_stack_00000840,in_stack_00000848,in_stack_00000850,
                       in_stack_00000858,in_stack_00000860,(Real)dt,in_stack_00000868,
                       in_stack_00000870,(Real)CONCAT44(uVar4,in_stack_fffffffffffffda8),
                       (Array4<const_double> *)flag);
            std::__cxx11::string::~string((string *)(local_b08 + 0x40));
          }
          else {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff290,(MFIter *)in_stack_fffffffffffff288,start_comp);
            mfi_00 = (MFIter *)local_550.local_index_map;
            in_stack_fffffffffffff2c8 = (anon_class_64_1_f62ae5da *)(in_RDI + 0x10);
            in_stack_fffffffffffff3a0._M_pi = local_298._M_pi;
            std::__cxx11::string::string
                      ((string *)(local_a68 + 0x40),
                       (string *)&diffusion_redistribution_type_abi_cxx11_);
            in_stack_fffffffffffff2e0 = (MFIter *)local_a68;
            amrex::Array4<const_double>::Array4((Array4<const_double> *)in_stack_fffffffffffff2e0);
            in_stack_fffffffffffff2d0 = (Box *)(local_a68 + 0x40);
            in_stack_fffffffffffff2a8 = (FabArrayBase *)&stack0xfffffffffffff860;
            in_stack_fffffffffffff290 = (FabArray<amrex::FArrayBox> *)local_6f0;
            in_stack_fffffffffffff288 = (FabArray<amrex::FArrayBox> *)(local_6f0 + 0x58);
            in_stack_fffffffffffff280 = (AmrLevel *)local_640;
            Redistribution::Apply
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0
                       ,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                       (Array4<double> *)scratch_00,in_stack_00000810,in_stack_00000818,
                       in_stack_00000820,in_stack_00000828,(Array4<const_double> *)div_arr,
                       in_stack_00000838,in_stack_00000840,in_stack_00000848,in_stack_00000850,
                       in_stack_00000858,in_stack_00000860,(Real)dt,in_stack_00000868,
                       in_stack_00000870,(Real)CONCAT44(uVar4,in_stack_fffffffffffffda8),
                       (Array4<const_double> *)flag);
            std::__cxx11::string::~string((string *)(local_a68 + 0x40));
          }
          amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_fffffffffffff280);
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0x50c80c);
        }
      }
      amrex::MFIter::operator++(&local_4d8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff280);
    amrex::EB_set_covered((MultiFab *)in_stack_fffffffffffff280,(Real)mfi_00);
    amrex::MultiFab::~MultiFab((MultiFab *)0x50c8d7);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
PeleLM::flux_divergenceRD(const MultiFab        &a_state,
                          int                    stateComp,
                          MultiFab              &a_divergence,
                          int                    divComp,
                          const MultiFab* const* a_fluxes,
                          int                    fluxComp,
                          int                    nComp,
                          BCRec const*           d_bc,
                          Real                   scale,
                          Real                   a_dt,
                          int areSpeciesFluxes)
{
#ifdef AMREX_USE_EB
   // Temporary divTemp to allow fillBoundary
   MultiFab divTemp(grids,dmap,nComp,a_state.nGrow(),MFInfo(),Factory());
   divTemp.setVal(0.0);

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(divTemp, 0, a_fluxes, fluxComp, nComp, scale);

   // FillBoundary
   divTemp.FillBoundary(geom.periodicity());

   // Redistribution
   auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(a_state.Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(a_divergence, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
        auto const& flagfab  = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag     = flagfab.const_array();
        auto const& div_arr  = a_divergence.array(mfi, divComp);
        auto const& divT_arr = divTemp.array(mfi);
        if (flagfab.getType(bx) != FabType::covered ) {
            if (flagfab.getType(grow(bx,4)) != FabType::regular) {
                //
                // Redistribute
                //
                AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

                AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

                auto const &ccc       = ebfact.getCentroid().const_array(mfi);
                auto const &vfrac_arr = ebfact.getVolFrac().const_array(mfi);

                // This is scratch space if calling StateRedistribute,
                //  but is used as the weights (here set to 1) if calling
                //  FluxRedistribute
                Box gbx = bx;

                if (diffusion_redistribution_type == "StateRedist" || 
                    diffusion_redistribution_type == "NewStateRedist")
                  gbx.grow(3);
                else if (diffusion_redistribution_type == "FluxRedist")
                  gbx.grow(2);

                FArrayBox tmpfab(gbx, nComp);
                Elixir eli = tmpfab.elixir();
                Array4<Real> scratch = tmpfab.array(0);
                if (diffusion_redistribution_type == "FluxRedist")
                {
                    amrex::ParallelFor(Box(scratch),
                    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    { scratch(i,j,k) = 1.;});
                }

                if (areSpeciesFluxes) {
                    // Placeholder for eventual species-specific treatment of the redistribution
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                } else {
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                }
            } else {
                // Move from divTmp to outgoing MF
                ParallelFor(bx, nComp, [div_arr, divT_arr]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { div_arr( i, j, k, n ) =  divT_arr(i,j,k,n); });
            }
        }
    }

   EB_set_covered(a_divergence,0.);
#else

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(a_divergence, divComp, a_fluxes, fluxComp, nComp, scale);

#endif
}